

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

bool aux_positioning_vertical(Board *board,int row,int col,Ship ship)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  if (ship.orientation == 'V') {
    if (ship.direction == -2) {
      uVar3 = row + 1;
      iVar2 = row - ship.length;
      bVar1 = (int)uVar3 < iVar2;
      if (iVar2 <= (int)uVar3) {
        do {
          bVar6 = false;
          uVar5 = col - 2;
          do {
            uVar5 = uVar5 + 1;
            if ((((-1 < (int)uVar3) && (-1 < (int)uVar5)) && ((int)uVar3 < board->row)) &&
               (((int)uVar5 < board->column &&
                (iVar4 = std::__cxx11::string::compare
                                   ((char *)((ulong)uVar5 * 0x20 +
                                            *(long *)&(board->matrix).
                                                                                                            
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data)), iVar4 != 0))))
            {
              if (!bVar6) goto LAB_00102e56;
              break;
            }
            bVar6 = col < (int)uVar5;
          } while ((int)uVar5 <= col);
          bVar1 = (int)uVar3 <= iVar2;
          bVar6 = iVar2 < (int)uVar3;
          uVar3 = uVar3 - 1;
        } while (bVar6);
      }
    }
    else if ((ship.direction == 2) && (bVar1 = ship.length < -1, -2 < ship.length)) {
      uVar3 = row - 1;
      do {
        bVar6 = false;
        uVar5 = col - 2;
        do {
          uVar5 = uVar5 + 1;
          if ((((-1 < (int)uVar3) && (-1 < (int)uVar5)) && ((int)uVar3 < board->row)) &&
             (((int)uVar5 < board->column &&
              (iVar2 = std::__cxx11::string::compare
                                 ((char *)((ulong)uVar5 * 0x20 +
                                          *(long *)&(board->matrix).
                                                                                                        
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data)), iVar2 != 0))))
          {
            if (!bVar6) {
LAB_00102e56:
              if (bVar1) {
                return true;
              }
              return false;
            }
            break;
          }
          bVar6 = col < (int)uVar5;
        } while ((int)uVar5 <= col);
        bVar1 = ship.length + row <= (int)uVar3;
        bVar6 = (int)uVar3 < ship.length + row;
        uVar3 = uVar3 + 1;
      } while (bVar6);
    }
  }
  return true;
}

Assistant:

bool aux_positioning_vertical( Board *board, int row, int col, Ship ship )
{
    if( ship.orientation == 'V' )
    {
        if( ship.direction == 2 )
        {
            for( int i = row - 1; i <= row + ship.length; i++ )
            {
                for( int j = col - 1; j <= col + 1; j++ )
                {

                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                        continue;
                    }


                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
        else if( ship.direction == -2 )
        {
            for( int i = row + 1; i >= row - ship.length; i-- )
            {
                for( int j = col - 1; j <= col + 1 ; j++ )
                {
                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                       continue;
                    }

                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
    }

    return true;
}